

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area)

{
  double dVar1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL det;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *area_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_tri_area(ref_node,nodes,area);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,*nodes,mlog1 + 5);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[1],mlog2 + 5);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[2],mlog + 5);
        if (ref_node_local._4_4_ == 0) {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            m[(long)ref_private_macro_code_rss_1 + 5] =
                 (mlog1[(long)ref_private_macro_code_rss_1 + 5] +
                  mlog2[(long)ref_private_macro_code_rss_1 + 5] +
                 mlog[(long)ref_private_macro_code_rss_1 + 5]) / 3.0;
          }
          ref_node_local._4_4_ = ref_matrix_exp_m(m + 5,&det);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = ref_matrix_det_m(&det,(REF_DBL *)&ref_private_macro_code_rss);
            if (ref_node_local._4_4_ == 0) {
              dVar1 = sqrt(_ref_private_macro_code_rss);
              *area = dVar1 * *area;
              dVar1 = sqrt(3.0);
              *area = (4.0 / dVar1) * *area;
              ref_node_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x938,"ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"det(mavg)");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x937,"ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"exp");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x935,"ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"log2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x934,"ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"log1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x933,
             "ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"log0");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x932,
           "ref_node_tri_metric_area",(ulong)ref_node_local._4_4_,"tri area");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *area) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], det;
  REF_INT i;

  RSS(ref_node_tri_area(ref_node, nodes, area), "tri area");
  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  (*area) *= sqrt(det);
  (*area) *= 4.0 / sqrt(3.0);

  return REF_SUCCESS;
}